

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

void rw::d3d8::uninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  Geometry *this;
  InstanceDataHeader *pIVar1;
  uint32 uVar2;
  uint16 *__src;
  int local_54;
  int32 j;
  uint16 *indices;
  Mesh *pMStack_40;
  uint32 i;
  Mesh *mesh;
  InstanceData *inst;
  InstanceDataHeader *header;
  Geometry *geo;
  ObjPipeline *pipe;
  Atomic *atomic_local;
  ObjPipeline *rwpipe_local;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) != 0) {
    uVar2 = MeshHeader::guessNumTriangles(this->meshHeader);
    this->numTriangles = uVar2;
    Geometry::allocateData(this);
    Geometry::allocateMeshes
              (this,(uint)this->meshHeader->numMeshes,this->meshHeader->totalIndices,0);
    pIVar1 = this->instData;
    mesh = *(Mesh **)(pIVar1 + 2);
    pMStack_40 = MeshHeader::getMeshes(this->meshHeader);
    for (indices._4_4_ = 0; indices._4_4_ < *(ushort *)((long)&pIVar1[1].platform + 2);
        indices._4_4_ = indices._4_4_ + 1) {
      __src = d3d::lockIndices(*(void **)&mesh[1].numIndices,0,0,0);
      if (*(int *)&mesh->indices == 0) {
        memcpy(pMStack_40->indices,__src,(long)(*(int *)&mesh->field_0xc << 1));
      }
      else {
        for (local_54 = 0; local_54 < *(int *)&mesh->field_0xc; local_54 = local_54 + 1) {
          pMStack_40->indices[local_54] = __src[local_54] + (short)*(undefined4 *)&mesh->indices;
        }
      }
      d3d::unlockIndices(*(void **)&mesh[1].numIndices);
      (**(code **)&rwpipe[1].super_Pipeline.platform)(this,mesh);
      pMStack_40 = pMStack_40 + 1;
      mesh = (Mesh *)&mesh[2].numIndices;
    }
    Geometry::generateTriangles(this,(int8 *)0x0);
    this->flags = this->flags & 0xfeffffff;
    destroyNativeData(this,0,0);
  }
  return;
}

Assistant:

static void
uninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_D3D8);
	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();
	geo->allocateMeshes(geo->meshHeader->numMeshes, geo->meshHeader->totalIndices, 0);

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	InstanceData *inst = header->inst;
	Mesh *mesh = geo->meshHeader->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		uint16 *indices = lockIndices(inst->indexBuffer, 0, 0, 0);
		if(inst->minVert == 0)
			memcpy(mesh->indices, indices, inst->numIndices*2);
		else
			for(int32 j = 0; j < inst->numIndices; j++)
				mesh->indices[j] = indices[j] + inst->minVert;
		unlockIndices(inst->indexBuffer);

		pipe->uninstanceCB(geo, inst);
		mesh++;
		inst++;
	}
	geo->generateTriangles();
	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
}